

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gop_structure.c
# Opt level: O0

void set_multi_layer_params_for_fp
               (TWO_PASS *twopass,TWO_PASS_FRAME *twopass_frame,GF_GROUP *gf_group,
               PRIMARY_RATE_CONTROL *p_rc,RATE_CONTROL *rc,FRAME_INFO *frame_info,int start,int end,
               int *cur_frame_idx,int *frame_ind,int *parallel_frame_count,int max_parallel_frames,
               int do_frame_parallel_encode,int *first_frame_index,int depth_thr,int *cur_disp_idx,
               int layer_depth)

{
  int iVar1;
  int iVar2;
  GF_GROUP *in_RCX;
  TWO_PASS_FRAME *in_RDX;
  TWO_PASS *in_RSI;
  PRIMARY_RATE_CONTROL *in_R8;
  RATE_CONTROL *in_R9;
  int unaff_retaddr;
  int in_stack_00000008;
  int in_stack_00000010;
  undefined4 in_stack_00000014;
  int *in_stack_00000018;
  int *in_stack_00000020;
  int in_stack_00000028;
  undefined4 in_stack_0000002c;
  int in_stack_00000030;
  undefined4 in_stack_00000038;
  undefined4 in_stack_0000003c;
  int in_stack_00000040;
  undefined4 in_stack_00000044;
  int in_stack_00000048;
  undefined4 in_stack_0000004c;
  int in_stack_00000050;
  undefined4 in_stack_00000054;
  int in_stack_00000058;
  int i_1;
  int layer_depth_for_intnl_overlay [4];
  int end_idx [4];
  int start_idx [4];
  int i;
  int b_frames [2];
  int f_frames [2];
  int offset [2];
  int arf_src_offsets [2];
  int m2;
  int m1;
  int arf_src_offset;
  int m;
  int num_frames_to_process;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *frame_ind_00;
  int *piVar6;
  undefined8 in_stack_fffffffffffffea0;
  GF_GROUP *pGVar7;
  FRAME_INFO *in_stack_fffffffffffffea8;
  PRIMARY_RATE_CONTROL *in_stack_fffffffffffffeb0;
  PRIMARY_RATE_CONTROL *p_rc_00;
  undefined4 in_stack_fffffffffffffebc;
  TWO_PASS *in_stack_fffffffffffffec0;
  TWO_PASS *twopass_00;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  int *in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  int in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined8 in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff18;
  int local_cc;
  int local_c8 [5];
  int local_b4;
  int local_b0;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94 [4];
  int local_84 [4];
  int local_74;
  int local_70;
  int local_6c;
  uint layer_depth_00;
  
  iVar1 = in_stack_00000010 - in_stack_00000008;
  if ((*(int *)((long)&in_RDX[0x44].frame_avg_haar_energy + 4) < in_stack_00000058) || (iVar1 < 3))
  {
    for (; in_stack_00000008 < in_stack_00000010; in_stack_00000008 = in_stack_00000008 + 1) {
      in_stack_fffffffffffffea8 =
           (FRAME_INFO *)CONCAT44((int)((ulong)in_stack_fffffffffffffea8 >> 0x20),in_stack_00000058)
      ;
      in_stack_fffffffffffffeb0 =
           (PRIMARY_RATE_CONTROL *)
           CONCAT44((int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),in_stack_00000008);
      set_params_for_leaf_frames
                (in_stack_fffffffffffffec0,
                 (TWO_PASS_FRAME *)CONCAT44(in_stack_fffffffffffffebc,in_stack_00000010),
                 in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                 (GF_GROUP *)CONCAT44(in_stack_00000054,in_stack_00000050),
                 (int *)CONCAT44(in_stack_00000044,in_stack_00000040),
                 (int *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffed8,in_stack_fffffffffffffee0,in_stack_fffffffffffffee8,
                 (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (int *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                 in_stack_ffffffffffffff00,(int)in_stack_ffffffffffffff08,
                 (int)in_stack_ffffffffffffff10);
    }
  }
  else {
    iVar2 = (in_stack_00000008 + in_stack_00000010 + -1) / 2;
    local_6c = iVar2 - in_stack_00000008;
    piVar4 = (int *)CONCAT44(in_stack_0000002c,in_stack_00000028);
    pGVar7 = (GF_GROUP *)CONCAT44((int)((ulong)in_stack_fffffffffffffea0 >> 0x20),0x7fffffff);
    p_rc_00 = (PRIMARY_RATE_CONTROL *)
              CONCAT44((int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),in_stack_00000058);
    twopass_00 = (TWO_PASS *)CONCAT44((int)((ulong)in_stack_fffffffffffffec0 >> 0x20),iVar2);
    piVar3 = in_stack_00000020;
    piVar6 = piVar4;
    set_params_for_internal_arfs
              (twopass_00,(TWO_PASS_FRAME *)CONCAT44(in_stack_fffffffffffffebc,local_6c),p_rc_00,
               (FRAME_INFO *)CONCAT44(in_stack_00000054,in_stack_00000050),pGVar7,
               (int *)CONCAT44(in_stack_00000044,in_stack_00000040),
               (int *)CONCAT44(in_stack_fffffffffffffed4,iVar2 - in_stack_00000008),
               in_stack_fffffffffffffed8,in_stack_fffffffffffffee0,in_stack_fffffffffffffee8,
               (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffef8,
               (int *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (int)in_stack_ffffffffffffff08,(int)in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff18,(int)in_stack_00000020,in_stack_00000028);
    if (in_stack_00000058 < in_stack_00000048) {
      piVar3 = (int *)CONCAT44(in_stack_0000002c,in_stack_00000028);
      piVar5 = (int *)CONCAT44((int)((ulong)piVar4 >> 0x20),iVar2);
      pGVar7 = (GF_GROUP *)CONCAT44((int)((ulong)pGVar7 >> 0x20),in_stack_00000030);
      piVar4 = in_stack_00000018;
      piVar6 = in_stack_00000020;
      set_multi_layer_params_for_fp
                (in_RSI,in_RDX,in_RCX,in_R8,in_R9,(FRAME_INFO *)CONCAT44(iVar1,iVar2),unaff_retaddr,
                 in_stack_00000008,(int *)CONCAT44(in_stack_00000014,in_stack_00000010),
                 in_stack_00000018,in_stack_00000020,in_stack_00000028,in_stack_00000030,
                 (int *)CONCAT44(in_stack_0000003c,in_stack_00000038),in_stack_00000040,
                 (int *)CONCAT44(in_stack_0000004c,in_stack_00000048),in_stack_00000050);
      set_params_for_intnl_overlay_frames
                (pGVar7,piVar3,piVar6,piVar4,piVar5,(int)((ulong)in_stack_00000020 >> 0x20));
      set_multi_layer_params_for_fp
                (in_RSI,in_RDX,in_RCX,in_R8,in_R9,(FRAME_INFO *)CONCAT44(iVar1,iVar2),unaff_retaddr,
                 in_stack_00000008,(int *)CONCAT44(in_stack_00000014,in_stack_00000010),
                 in_stack_00000018,in_stack_00000020,in_stack_00000028,in_stack_00000030,
                 (int *)CONCAT44(in_stack_0000003c,in_stack_00000038),in_stack_00000040,
                 (int *)CONCAT44(in_stack_0000004c,in_stack_00000048),in_stack_00000050);
    }
    else {
      local_70 = (iVar2 + in_stack_00000008 + -1) / 2;
      local_74 = (iVar2 + 1 + in_stack_00000010) / 2;
      local_84[2] = local_70 - in_stack_00000008;
      local_84[3] = local_74 - in_stack_00000008;
      local_84[0] = local_70;
      local_84[1] = local_74;
      local_94[2] = iVar2 - local_70;
      local_94[3] = in_stack_00000010 - local_74;
      local_94[0] = local_70 - in_stack_00000008;
      local_94[1] = local_74 - (iVar2 + 1);
      for (local_98 = 0; local_98 < 2; local_98 = local_98 + 1) {
        piVar4 = (int *)CONCAT44(in_stack_0000002c,in_stack_00000028);
        pGVar7 = (GF_GROUP *)CONCAT44((int)((ulong)pGVar7 >> 0x20),in_stack_00000048);
        p_rc_00 = (PRIMARY_RATE_CONTROL *)
                  CONCAT44((int)((ulong)p_rc_00 >> 0x20),in_stack_00000058 + 1);
        twopass_00 = (TWO_PASS *)CONCAT44((int)((ulong)twopass_00 >> 0x20),local_84[local_98]);
        set_params_for_internal_arfs
                  (twopass_00,
                   (TWO_PASS_FRAME *)
                   CONCAT44(in_stack_fffffffffffffebc,local_84[(long)local_98 + 2]),p_rc_00,
                   (FRAME_INFO *)CONCAT44(in_stack_00000054,in_stack_00000050),pGVar7,
                   (int *)CONCAT44(in_stack_00000044,in_stack_00000040),
                   (int *)CONCAT44(in_stack_fffffffffffffed4,local_94[local_98]),
                   in_stack_fffffffffffffed8,in_stack_fffffffffffffee0,in_stack_fffffffffffffee8,
                   (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   in_stack_fffffffffffffef8,
                   (int *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   (int)in_stack_00000020,in_stack_00000028,in_stack_00000030,(int)piVar3,
                   (int)piVar6);
      }
      local_a4 = local_70 + 1;
      local_a0 = iVar2 + 1;
      local_9c = in_stack_00000010 + -1;
      local_c8[4] = local_70;
      local_b4 = iVar2;
      local_b0 = local_74;
      local_c8[0] = in_stack_00000058 + 1;
      local_c8[1] = in_stack_00000058;
      local_c8[2] = in_stack_00000058 + 1;
      local_c8[3] = 0xffffffff;
      piVar3 = in_stack_00000020;
      for (local_cc = 0; local_cc < 4; local_cc = local_cc + 1) {
        piVar6 = (int *)CONCAT44(in_stack_0000002c,in_stack_00000028);
        layer_depth_00 = (uint)((ulong)piVar3 >> 0x20);
        piVar3 = (int *)((ulong)layer_depth_00 << 0x20);
        piVar4 = (int *)CONCAT44((int)((ulong)piVar4 >> 0x20),local_c8[(long)local_cc + 4]);
        pGVar7 = (GF_GROUP *)CONCAT44((int)((ulong)pGVar7 >> 0x20),in_stack_00000030);
        piVar5 = in_stack_00000018;
        frame_ind_00 = in_stack_00000020;
        set_multi_layer_params_for_fp
                  (in_RSI,in_RDX,in_RCX,in_R8,in_R9,(FRAME_INFO *)CONCAT44(iVar1,iVar2),
                   unaff_retaddr,in_stack_00000008,
                   (int *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_00000018,
                   in_stack_00000020,in_stack_00000028,in_stack_00000030,
                   (int *)CONCAT44(in_stack_0000003c,in_stack_00000038),in_stack_00000040,
                   (int *)CONCAT44(in_stack_0000004c,in_stack_00000048),in_stack_00000050);
        if (local_c8[local_cc] != -1) {
          set_params_for_intnl_overlay_frames
                    (pGVar7,piVar6,frame_ind_00,piVar5,piVar4,layer_depth_00);
        }
      }
    }
  }
  return;
}

Assistant:

static void set_multi_layer_params_for_fp(
    const TWO_PASS *twopass, const TWO_PASS_FRAME *twopass_frame,
    GF_GROUP *const gf_group, const PRIMARY_RATE_CONTROL *p_rc,
    RATE_CONTROL *rc, FRAME_INFO *frame_info, int start, int end,
    int *cur_frame_idx, int *frame_ind, int *parallel_frame_count,
    int max_parallel_frames, int do_frame_parallel_encode,
    int *first_frame_index, int depth_thr, int *cur_disp_idx, int layer_depth) {
  const int num_frames_to_process = end - start;

  // Either we are at the last level of the pyramid, or we don't have enough
  // frames between 'l' and 'r' to create one more level.
  if (layer_depth > gf_group->max_layer_depth_allowed ||
      num_frames_to_process < 3) {
    // Leaf nodes.
    while (start < end) {
      set_params_for_leaf_frames(twopass, twopass_frame, p_rc, frame_info,
                                 gf_group, cur_frame_idx, frame_ind,
                                 parallel_frame_count, max_parallel_frames,
                                 do_frame_parallel_encode, first_frame_index,
                                 cur_disp_idx, layer_depth, start, end);
      ++start;
    }
  } else {
    const int m = (start + end - 1) / 2;

    // Internal ARF.
    int arf_src_offset = m - start;
    set_params_for_internal_arfs(
        twopass, twopass_frame, p_rc, frame_info, gf_group, cur_frame_idx,
        frame_ind, parallel_frame_count, max_parallel_frames,
        do_frame_parallel_encode, first_frame_index, INT_MAX, cur_disp_idx,
        layer_depth, arf_src_offset, m, end - m, m - start);

    // If encode reordering is enabled, configure the multi-layers accordingly
    // and return. For e.g., the encode order for gf-interval 16 after
    // reordering would be 0-> 16-> 8-> 4-> 2-> 6-> 1-> 3-> 5-> 7-> 12-> 10->
    // 14-> 9-> 11-> 13-> 15.
    if (layer_depth >= depth_thr) {
      int m1 = (m + start - 1) / 2;
      int m2 = (m + 1 + end) / 2;
      int arf_src_offsets[2] = { m1 - start, m2 - start };
      // Parameters to compute arf_boost.
      int offset[2] = { m1, m2 };
      int f_frames[2] = { m - m1, end - m2 };
      int b_frames[2] = { m1 - start, m2 - (m + 1) };

      // Set GF_GROUP params for INTNL_ARF_UPDATE frames which are reordered.
      for (int i = 0; i < 2; i++) {
        set_params_for_internal_arfs(
            twopass, twopass_frame, p_rc, frame_info, gf_group, cur_frame_idx,
            frame_ind, parallel_frame_count, max_parallel_frames,
            do_frame_parallel_encode, first_frame_index, depth_thr,
            cur_disp_idx, layer_depth + 1, arf_src_offsets[i], offset[i],
            f_frames[i], b_frames[i]);
      }

      // Initialize the start and end indices to configure LF_UPDATE frames.
      int start_idx[4] = { start, m1 + 1, m + 1, end - 1 };
      int end_idx[4] = { m1, m, m2, end };
      int layer_depth_for_intnl_overlay[4] = { layer_depth + 1, layer_depth,
                                               layer_depth + 1, INVALID_IDX };

      // Set GF_GROUP params for the rest of LF_UPDATE and INTNL_OVERLAY_UPDATE
      // frames after reordering.
      for (int i = 0; i < 4; i++) {
        set_multi_layer_params_for_fp(
            twopass, twopass_frame, gf_group, p_rc, rc, frame_info,
            start_idx[i], end_idx[i], cur_frame_idx, frame_ind,
            parallel_frame_count, max_parallel_frames, do_frame_parallel_encode,
            first_frame_index, depth_thr, cur_disp_idx, layer_depth + 2);
        if (layer_depth_for_intnl_overlay[i] != INVALID_IDX)
          set_params_for_intnl_overlay_frames(
              gf_group, cur_frame_idx, frame_ind, first_frame_index,
              cur_disp_idx, layer_depth_for_intnl_overlay[i]);
      }
      return;
    }

    // Frames displayed before this internal ARF.
    set_multi_layer_params_for_fp(
        twopass, twopass_frame, gf_group, p_rc, rc, frame_info, start, m,
        cur_frame_idx, frame_ind, parallel_frame_count, max_parallel_frames,
        do_frame_parallel_encode, first_frame_index, depth_thr, cur_disp_idx,
        layer_depth + 1);

    // Overlay for internal ARF.
    set_params_for_intnl_overlay_frames(gf_group, cur_frame_idx, frame_ind,
                                        first_frame_index, cur_disp_idx,
                                        layer_depth);

    // Frames displayed after this internal ARF.
    set_multi_layer_params_for_fp(
        twopass, twopass_frame, gf_group, p_rc, rc, frame_info, m + 1, end,
        cur_frame_idx, frame_ind, parallel_frame_count, max_parallel_frames,
        do_frame_parallel_encode, first_frame_index, depth_thr, cur_disp_idx,
        layer_depth + 1);
  }
}